

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll-test.c
# Opt level: O1

void add_existing_impl(_Bool change_udata)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  undefined8 uVar5;
  char *pcVar6;
  uint8_t data;
  int fds [3];
  epoll_event event;
  epoll_event event_result;
  undefined1 local_3d;
  int local_3c;
  int local_38;
  int local_34;
  epoll_event local_30;
  int local_20;
  
  iVar1 = epoll_create1(0x80000);
  if (iVar1 < 0) {
    pcVar6 = "%s:%d: %s not met";
    pcVar4 = "ep >= 0";
    uVar5 = 0x21d;
  }
  else {
    fd_pipe(&local_3c);
    local_30.events = 1;
    local_30._4_4_ = 0x2a;
    iVar2 = epoll_ctl(iVar1,1,local_3c,&local_30);
    if (iVar2 == 0) {
      if (change_udata) {
        local_30._4_4_ = 0x2b;
      }
      iVar2 = epoll_ctl(iVar1,1,local_3c,&local_30);
      if (iVar2 < 0) {
        piVar3 = __errno_location();
        iVar2 = *piVar3;
        if (iVar2 != 0x11) {
          uVar5 = 0x22d;
LAB_0010522c:
          microatf_fail_require
                    ("%s:%d: Expected errno %d, got %d, in %s",
                     "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
                     ,uVar5,0x11,iVar2,"epoll_ctl(ep, EPOLL_CTL_ADD, fds[0], &event) < 0");
        }
        iVar2 = epoll_ctl(iVar1,1,local_3c,&local_30);
        if (iVar2 < 0) {
          iVar2 = *piVar3;
          if (iVar2 != 0x11) {
            uVar5 = 0x22f;
            goto LAB_0010522c;
          }
          local_3d = 0;
          write(local_38,&local_3d,1);
          iVar2 = epoll_wait(iVar1,(epoll_event *)((long)&local_30.data + 4),1,-1);
          if (iVar2 == 1) {
            if (local_20 == 0x2a) {
              iVar2 = close(local_3c);
              if (iVar2 == 0) {
                iVar2 = close(local_38);
                if (iVar2 == 0) {
                  if (local_34 != -1) {
                    iVar2 = close(local_34);
                    if (iVar2 != 0) {
                      pcVar6 = "%s:%d: %s not met";
                      pcVar4 = "fds[2] == -1 || close(fds[2]) == 0";
                      uVar5 = 0x23b;
                      goto LAB_001052e1;
                    }
                  }
                  iVar1 = close(iVar1);
                  if (iVar1 == 0) {
                    return;
                  }
                  pcVar6 = "%s:%d: %s not met";
                  pcVar4 = "close(ep) == 0";
                  uVar5 = 0x23c;
                }
                else {
                  pcVar6 = "%s:%d: %s not met";
                  pcVar4 = "close(fds[1]) == 0";
                  uVar5 = 0x23a;
                }
              }
              else {
                pcVar6 = "%s:%d: %s not met";
                pcVar4 = "close(fds[0]) == 0";
                uVar5 = 0x239;
              }
            }
            else {
              pcVar6 = "%s:%d: %s not met";
              pcVar4 = "event_result.data.u32 == 42";
              uVar5 = 0x237;
            }
          }
          else {
            pcVar6 = "%s:%d: %s not met";
            pcVar4 = "epoll_wait(ep, &event_result, 1, -1) == 1";
            uVar5 = 0x235;
          }
        }
        else {
          pcVar6 = "%s:%d: Expected true value in %s";
          pcVar4 = "epoll_ctl(ep, EPOLL_CTL_ADD, fds[0], &event) < 0";
          uVar5 = 0x22f;
        }
      }
      else {
        pcVar6 = "%s:%d: Expected true value in %s";
        pcVar4 = "epoll_ctl(ep, EPOLL_CTL_ADD, fds[0], &event) < 0";
        uVar5 = 0x22d;
      }
    }
    else {
      pcVar6 = "%s:%d: %s not met";
      pcVar4 = "epoll_ctl(ep, EPOLL_CTL_ADD, fds[0], &event) == 0";
      uVar5 = 0x226;
    }
  }
LAB_001052e1:
  microatf_fail_require
            (pcVar6,
             "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
             ,uVar5,pcVar4);
}

Assistant:

static void
add_existing_impl(bool change_udata)
{
	int ep = epoll_create1(EPOLL_CLOEXEC);
	ATF_REQUIRE(ep >= 0);

	int fds[3];
	fd_pipe(fds);

	struct epoll_event event;
	event.events = EPOLLIN;
	event.data.u32 = 42;

	ATF_REQUIRE(epoll_ctl(ep, EPOLL_CTL_ADD, fds[0], &event) == 0);

	if (change_udata) {
		event.data.u32 = 43;
	}

	ATF_REQUIRE_ERRNO(EEXIST,
	    epoll_ctl(ep, EPOLL_CTL_ADD, fds[0], &event) < 0);
	ATF_REQUIRE_ERRNO(EEXIST,
	    epoll_ctl(ep, EPOLL_CTL_ADD, fds[0], &event) < 0);

	uint8_t data = '\0';
	write(fds[1], &data, 1);

	struct epoll_event event_result;
	ATF_REQUIRE(epoll_wait(ep, &event_result, 1, -1) == 1);

	ATF_REQUIRE(event_result.data.u32 == 42);

	ATF_REQUIRE(close(fds[0]) == 0);
	ATF_REQUIRE(close(fds[1]) == 0);
	ATF_REQUIRE(fds[2] == -1 || close(fds[2]) == 0);
	ATF_REQUIRE(close(ep) == 0);
}